

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O0

void from_mat44(double *mat4_4,IkReal *eetrans,IkReal *eerot)

{
  int local_24;
  int i;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  double *mat4_4_local;
  
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    eerot[local_24 * 3] = mat4_4[local_24 << 2];
    eerot[local_24 * 3 + 1] = mat4_4[local_24 * 4 + 1];
    eerot[local_24 * 3 + 2] = mat4_4[local_24 * 4 + 2];
    eetrans[local_24] = mat4_4[local_24 * 4 + 3];
  }
  return;
}

Assistant:

void from_mat44(const double * mat4_4, IkReal* eetrans, IkReal* eerot)
{
    for(int i=0; i< 3;++i){
        eerot[i*3+0] = mat4_4[i*4+0];
        eerot[i*3+1] = mat4_4[i*4+1];
        eerot[i*3+2] = mat4_4[i*4+2];
        eetrans[i] = mat4_4[i*4+3];
    }
}